

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<char,fmt::v10::appender,double>
                   (appender out,double value,format_specs<char> specs,locale_ref loc)

{
  locale_ref loc_00;
  string_view bytes;
  format_specs<char> specs_00;
  appender out_00;
  bool bVar1;
  char cVar2;
  type s;
  int iVar3;
  int iVar4;
  float_specs fVar5;
  appender *paVar6;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_01;
  size_t count;
  undefined8 in_RDX;
  long in_RSI;
  buffer<char> *in_RDI;
  double in_XMM0_Qa;
  big_decimal_fp f;
  int exp;
  int precision;
  memory_buffer buffer;
  appender it;
  float_specs fspecs;
  allocator<char> *in_stack_fffffffffffffc98;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  format_specs<char> *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int iVar7;
  undefined4 in_stack_fffffffffffffcbc;
  float_specs in_stack_fffffffffffffcc0;
  buffer<char> *this;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffcc8;
  float_specs *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd04;
  undefined1 isnan;
  undefined8 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  int iVar8;
  undefined4 in_stack_fffffffffffffd1c;
  basic_string_view<char> local_2e0;
  buffer<char> *local_2d0;
  ulong local_2c8;
  char local_2bd;
  buffer<char> *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd54;
  _func_int **in_stack_fffffffffffffd58;
  float_specs in_stack_fffffffffffffd60;
  buffer<char> *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  double in_stack_fffffffffffffe90;
  float_specs in_stack_fffffffffffffe9c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_78;
  char local_69;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_68;
  long local_60;
  undefined8 local_58;
  buffer<char> *local_50;
  undefined8 local_40;
  double local_38;
  undefined8 local_28;
  undefined8 local_20;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  double local_8;
  
  isnan = (undefined1)((uint)in_stack_fffffffffffffd04 >> 0x18);
  local_38 = in_XMM0_Qa;
  local_28 = in_RSI;
  local_20 = in_RDX;
  local_18.container = in_RDI;
  fVar5 = parse_float_type_spec<fmt::v10::detail::error_handler,char>
                    (in_stack_fffffffffffffca8,(error_handler *)in_stack_fffffffffffffca0);
  local_40._4_4_ = fVar5._4_4_;
  local_40 = CONCAT44(local_40._4_4_ & 0xffff00ff | (uint)((byte)(local_20._1_2_ >> 4) & 7) << 8,
                      fVar5.precision);
  local_8 = local_38;
  bVar1 = std::signbit(local_38);
  if (bVar1) {
    local_40 = local_40 & 0xffff00ffffffffff | 0x10000000000;
    local_38 = -local_38;
  }
  else if ((local_40._4_4_ >> 8 & 0xff) == 1) {
    local_40 = local_40 & 0xffff00ffffffffff;
  }
  bVar1 = isfinite<double,_0>((double)in_stack_fffffffffffffca0);
  if (bVar1) {
    if ((((byte)((ulong)local_20 >> 8) & 0xf) == 4) && ((char)(local_40 >> 0x28) != '\0')) {
      paVar6 = reserve<fmt::v10::appender>((appender *)&local_18,1);
      local_68.container =
           (paVar6->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_69 = sign<char,fmt::v10::sign::type>((type)(local_40 >> 0x28));
      local_78.container = (buffer<char> *)appender::operator++((appender *)&local_68,0);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_78);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)in_stack_fffffffffffffca0,
                 (value_type *)in_stack_fffffffffffffc98);
      local_18.container =
           (buffer<char> *)base_iterator<fmt::v10::appender>(local_18.container,local_68.container);
      local_40 = local_40 & 0xffff00ffffffffff;
      if ((int)local_28 != 0) {
        local_28 = CONCAT44(local_28._4_4_,(int)local_28 + -1);
      }
    }
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd57);
    cVar2 = (char)(local_40 >> 0x20);
    if (cVar2 == '\x03') {
      s = (type)(local_40 >> 0x28);
      if (s != none) {
        local_2bd = sign<char,fmt::v10::sign::type>(s);
        buffer<char>::push_back
                  (&in_stack_fffffffffffffca0->super_buffer<char>,(char *)in_stack_fffffffffffffc98)
        ;
      }
      convert_float<double>(local_38);
      local_2c8 = local_40;
      format_hexfloat<double,_0>
                ((double)in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                 in_stack_fffffffffffffd60,in_stack_fffffffffffffd48);
      local_2d0 = local_18.container;
      this = (buffer<char> *)&stack0xfffffffffffffd58;
      out_01.container = (buffer<char> *)buffer<char>::data(this);
      count = buffer<char>::size(this);
      basic_string_view<char>::basic_string_view(&local_2e0,(char *)out_01.container,count);
      bytes.data_._4_4_ = in_stack_fffffffffffffcbc;
      bytes.data_._0_4_ = in_stack_fffffffffffffcb8;
      bytes.size_ = (size_t)this;
      local_10.container =
           (buffer<char> *)
           write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                     (out_01.container,bytes,
                      (format_specs<char> *)
                      CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    }
    else {
      iVar7 = local_28._4_4_;
      if ((local_28 < 0) && ((char)local_20 != '\0')) {
        iVar7 = 6;
      }
      if (cVar2 == '\x01') {
        iVar8 = iVar7;
        iVar4 = iVar7;
        iVar3 = max_value<int>();
        if (iVar7 == iVar3) {
          throw_format_error((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        }
        in_stack_fffffffffffffcb8 = iVar7;
        iVar7 = iVar8;
        iVar8 = iVar4 + 1;
      }
      else {
        iVar8 = iVar7;
        if ((cVar2 != '\x02') && (iVar7 == 0)) {
          iVar8 = 1;
        }
      }
      convert_float<double>(local_38);
      iVar4 = format_float<double>
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                         in_stack_fffffffffffffe9c,in_stack_fffffffffffffe80);
      local_40 = CONCAT44(local_40._4_4_,iVar8);
      in_stack_fffffffffffffca0 =
           (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&stack0xfffffffffffffd58;
      buffer<char>::data((buffer<char> *)in_stack_fffffffffffffca0);
      buffer<char>::size(&in_stack_fffffffffffffca0->super_buffer<char>);
      loc_00.locale_._4_4_ = iVar7;
      loc_00.locale_._0_4_ = in_stack_fffffffffffffcb8;
      local_10.container =
           (buffer<char> *)
           write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                     (in_stack_fffffffffffffcc8.container,
                      (big_decimal_fp *)CONCAT44(iVar4,in_stack_fffffffffffffcb0),
                      in_stack_fffffffffffffca8,in_stack_fffffffffffffcc0,loc_00);
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              (in_stack_fffffffffffffca0);
  }
  else {
    local_50 = local_18.container;
    isnan<double>(local_38);
    local_60 = local_28;
    local_58 = local_20;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffd1c;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffd18;
    specs_00.type = (char)in_stack_fffffffffffffd10;
    specs_00._9_2_ = (short)((uint)in_stack_fffffffffffffd10 >> 8);
    specs_00.fill.data_[0] = (char)((uint)in_stack_fffffffffffffd10 >> 0x18);
    specs_00.width = (int)in_stack_fffffffffffffd08;
    specs_00.precision = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    specs_00.fill.data_[1] = (char)in_stack_fffffffffffffd14;
    specs_00.fill.data_[2] = (char)((uint)in_stack_fffffffffffffd14 >> 8);
    specs_00.fill.data_[3] = (char)((uint)in_stack_fffffffffffffd14 >> 0x10);
    specs_00.fill.size_ = (char)((uint)in_stack_fffffffffffffd14 >> 0x18);
    local_10.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out_00,(bool)isnan,specs_00,in_stack_fffffffffffffcf8);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}